

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O2

CURLcode Curl_vsetopt(Curl_easy *data,CURLoption option,__va_list_tag *param)

{
  undefined1 *puVar1;
  curl_blob *blob;
  Curl_share *pCVar2;
  FILE *pFVar3;
  curl_read_callback p_Var4;
  size_t length;
  char *string;
  byte bVar5;
  _Bool _Var6;
  ushort uVar7;
  unsigned_short uVar8;
  uint uVar9;
  CURLoption CVar10;
  CURLcode CVar11;
  int iVar12;
  CURLcode CVar13;
  CURLcode CVar14;
  ulong *puVar15;
  undefined8 *puVar16;
  long *plVar17;
  Curl_share *pCVar18;
  altsvcinfo *paVar19;
  ulong uVar20;
  code *pcVar21;
  hsts *phVar22;
  char *pcVar23;
  curl_slist *pcVar24;
  CookieInfo *pCVar25;
  size_t sVar26;
  byte bVar27;
  ushort uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  curl_progress_callback p_Var32;
  PslCache *pPVar33;
  ssl_config_data *psVar34;
  hsts **hp;
  curl_prot_t *val;
  char **charp;
  CURLU *__s;
  CURLcode CVar35;
  curl_off_t *pcVar36;
  char *iface;
  char *host;
  char *u;
  
  CVar13 = CURLE_UNKNOWN_OPTION;
  if (9999 < option) {
    if (19999 < option) {
      if (option < 30000) {
        switch(option) {
        case CURLOPT_INTERLEAVEFUNCTION:
          uVar9 = param->gp_offset;
          if ((ulong)uVar9 < 0x29) {
            puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
            param->gp_offset = uVar9 + 8;
          }
          else {
            puVar16 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar16 + 1;
          }
          (data->set).fwrite_rtp = (curl_write_callback)*puVar16;
          break;
        case 0x4ee5:
          goto switchD_0014e305_caseD_f;
        case CURLOPT_CHUNK_BGN_FUNCTION:
          uVar9 = param->gp_offset;
          if ((ulong)uVar9 < 0x29) {
            puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
            param->gp_offset = uVar9 + 8;
          }
          else {
            puVar16 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar16 + 1;
          }
          (data->set).chunk_bgn = (curl_chunk_bgn_callback)*puVar16;
          break;
        case CURLOPT_CHUNK_END_FUNCTION:
          uVar9 = param->gp_offset;
          if ((ulong)uVar9 < 0x29) {
            puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
            param->gp_offset = uVar9 + 8;
          }
          else {
            puVar16 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar16 + 1;
          }
          (data->set).chunk_end = (curl_chunk_end_callback)*puVar16;
          break;
        case CURLOPT_FNMATCH_FUNCTION:
          uVar9 = param->gp_offset;
          if ((ulong)uVar9 < 0x29) {
            puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
            param->gp_offset = uVar9 + 8;
          }
          else {
            puVar16 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar16 + 1;
          }
          (data->set).fnmatch = (curl_fnmatch_callback)*puVar16;
          break;
        default:
          if (option == CURLOPT_WRITEFUNCTION) {
            uVar9 = param->gp_offset;
            if ((ulong)uVar9 < 0x29) {
              plVar17 = (long *)((ulong)uVar9 + (long)param->reg_save_area);
              param->gp_offset = uVar9 + 8;
            }
            else {
              plVar17 = (long *)param->overflow_arg_area;
              param->overflow_arg_area = plVar17 + 1;
            }
            pcVar21 = (code *)*plVar17;
            if (pcVar21 == (curl_write_callback)0x0) {
              pcVar21 = fwrite;
            }
            (data->set).fwrite_func = pcVar21;
          }
          else if (option == CURLOPT_READFUNCTION) {
            uVar9 = param->gp_offset;
            if ((ulong)uVar9 < 0x29) {
              plVar17 = (long *)((ulong)uVar9 + (long)param->reg_save_area);
              param->gp_offset = uVar9 + 8;
            }
            else {
              plVar17 = (long *)param->overflow_arg_area;
              param->overflow_arg_area = plVar17 + 1;
            }
            p_Var4 = (curl_read_callback)*plVar17;
            (data->set).fread_func_set = p_Var4;
            uVar20 = *(ulong *)&(data->set).field_0x894;
            if (p_Var4 != (curl_read_callback)0x0) {
              uVar20 = uVar20 | 0x10;
              goto LAB_0014fb88;
            }
            *(ulong *)&(data->set).field_0x894 = uVar20 & 0xffffffffffffffef;
            (data->set).fread_func_set = fread;
          }
          else if (option == CURLOPT_PREREQFUNCTION) {
            uVar9 = param->gp_offset;
            if ((ulong)uVar9 < 0x29) {
              puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
              param->gp_offset = uVar9 + 8;
            }
            else {
              puVar16 = (undefined8 *)param->overflow_arg_area;
              param->overflow_arg_area = puVar16 + 1;
            }
            (data->set).fprereq = (curl_prereq_callback)*puVar16;
          }
          else if (option == CURLOPT_HEADERFUNCTION) {
            uVar9 = param->gp_offset;
            if ((ulong)uVar9 < 0x29) {
              puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
              param->gp_offset = uVar9 + 8;
            }
            else {
              puVar16 = (undefined8 *)param->overflow_arg_area;
              param->overflow_arg_area = puVar16 + 1;
            }
            (data->set).fwrite_header = (curl_write_callback)*puVar16;
          }
          else if (option == CURLOPT_DEBUGFUNCTION) {
            uVar9 = param->gp_offset;
            if ((ulong)uVar9 < 0x29) {
              puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
              param->gp_offset = uVar9 + 8;
            }
            else {
              puVar16 = (undefined8 *)param->overflow_arg_area;
              param->overflow_arg_area = puVar16 + 1;
            }
            (data->set).fdebug = (curl_debug_callback)*puVar16;
          }
          else if (option == CURLOPT_SSL_CTX_FUNCTION) {
            _Var6 = Curl_ssl_supports(data,8);
            if (!_Var6) {
              return CURLE_NOT_BUILT_IN;
            }
            uVar9 = param->gp_offset;
            if ((ulong)uVar9 < 0x29) {
              puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
              param->gp_offset = uVar9 + 8;
            }
            else {
              puVar16 = (undefined8 *)param->overflow_arg_area;
              param->overflow_arg_area = puVar16 + 1;
            }
            (data->set).ssl.fsslctx = (curl_ssl_ctx_callback)*puVar16;
          }
          else if (option == CURLOPT_IOCTLFUNCTION) {
            uVar9 = param->gp_offset;
            if ((ulong)uVar9 < 0x29) {
              puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
              param->gp_offset = uVar9 + 8;
            }
            else {
              puVar16 = (undefined8 *)param->overflow_arg_area;
              param->overflow_arg_area = puVar16 + 1;
            }
            (data->set).ioctl_func = (curl_ioctl_callback)*puVar16;
          }
          else if (option == CURLOPT_SOCKOPTFUNCTION) {
            uVar9 = param->gp_offset;
            if ((ulong)uVar9 < 0x29) {
              puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
              param->gp_offset = uVar9 + 8;
            }
            else {
              puVar16 = (undefined8 *)param->overflow_arg_area;
              param->overflow_arg_area = puVar16 + 1;
            }
            (data->set).fsockopt = (curl_sockopt_callback)*puVar16;
          }
          else if (option == CURLOPT_OPENSOCKETFUNCTION) {
            uVar9 = param->gp_offset;
            if ((ulong)uVar9 < 0x29) {
              puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
              param->gp_offset = uVar9 + 8;
            }
            else {
              puVar16 = (undefined8 *)param->overflow_arg_area;
              param->overflow_arg_area = puVar16 + 1;
            }
            (data->set).fopensocket = (curl_opensocket_callback)*puVar16;
          }
          else if (option == CURLOPT_SEEKFUNCTION) {
            uVar9 = param->gp_offset;
            if ((ulong)uVar9 < 0x29) {
              puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
              param->gp_offset = uVar9 + 8;
            }
            else {
              puVar16 = (undefined8 *)param->overflow_arg_area;
              param->overflow_arg_area = puVar16 + 1;
            }
            (data->set).seek_func = (curl_seek_callback)*puVar16;
          }
          else if (option == CURLOPT_CLOSESOCKETFUNCTION) {
            uVar9 = param->gp_offset;
            if ((ulong)uVar9 < 0x29) {
              puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
              param->gp_offset = uVar9 + 8;
            }
            else {
              puVar16 = (undefined8 *)param->overflow_arg_area;
              param->overflow_arg_area = puVar16 + 1;
            }
            (data->set).fclosesocket = (curl_closesocket_callback)*puVar16;
          }
          else if (option == CURLOPT_XFERINFOFUNCTION) {
            uVar9 = param->gp_offset;
            if ((ulong)uVar9 < 0x29) {
              plVar17 = (long *)((ulong)uVar9 + (long)param->reg_save_area);
              param->gp_offset = uVar9 + 8;
            }
            else {
              plVar17 = (long *)param->overflow_arg_area;
              param->overflow_arg_area = plVar17 + 1;
            }
            p_Var32 = (curl_progress_callback)*plVar17;
            (data->set).fxferinfo = (curl_xferinfo_callback)p_Var32;
LAB_0014fcf7:
            bVar5 = (data->progress).field_0x1ac;
            if (p_Var32 == (curl_progress_callback)0x0) {
              bVar5 = bVar5 & 0xfe;
            }
            else {
              bVar5 = bVar5 | 1;
            }
            (data->progress).field_0x1ac = bVar5;
          }
          else if (option == CURLOPT_RESOLVER_START_FUNCTION) {
            uVar9 = param->gp_offset;
            if ((ulong)uVar9 < 0x29) {
              puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
              param->gp_offset = uVar9 + 8;
            }
            else {
              puVar16 = (undefined8 *)param->overflow_arg_area;
              param->overflow_arg_area = puVar16 + 1;
            }
            (data->set).resolver_start = (curl_resolver_start_callback)*puVar16;
          }
          else if (option == CURLOPT_TRAILERFUNCTION) {
            uVar9 = param->gp_offset;
            if ((ulong)uVar9 < 0x29) {
              puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
              param->gp_offset = uVar9 + 8;
            }
            else {
              puVar16 = (undefined8 *)param->overflow_arg_area;
              param->overflow_arg_area = puVar16 + 1;
            }
            (data->set).trailer_callback = (curl_trailer_callback)*puVar16;
          }
          else if (option == CURLOPT_HSTSREADFUNCTION) {
            uVar9 = param->gp_offset;
            if ((ulong)uVar9 < 0x29) {
              puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
              param->gp_offset = uVar9 + 8;
            }
            else {
              puVar16 = (undefined8 *)param->overflow_arg_area;
              param->overflow_arg_area = puVar16 + 1;
            }
            (data->set).hsts_read = (curl_hstsread_callback)*puVar16;
          }
          else {
            if (option != CURLOPT_HSTSWRITEFUNCTION) {
              if (option != CURLOPT_PROGRESSFUNCTION) {
                return CURLE_UNKNOWN_OPTION;
              }
              uVar9 = param->gp_offset;
              if ((ulong)uVar9 < 0x29) {
                plVar17 = (long *)((ulong)uVar9 + (long)param->reg_save_area);
                param->gp_offset = uVar9 + 8;
              }
              else {
                plVar17 = (long *)param->overflow_arg_area;
                param->overflow_arg_area = plVar17 + 1;
              }
              p_Var32 = (curl_progress_callback)*plVar17;
              (data->set).fprogress = p_Var32;
              goto LAB_0014fcf7;
            }
            uVar9 = param->gp_offset;
            if ((ulong)uVar9 < 0x29) {
              puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
              param->gp_offset = uVar9 + 8;
            }
            else {
              puVar16 = (undefined8 *)param->overflow_arg_area;
              param->overflow_arg_area = puVar16 + 1;
            }
            (data->set).hsts_write = (curl_hstswrite_callback)*puVar16;
          }
        }
        goto switchD_0014e305_caseD_5b;
      }
      uVar9 = param->gp_offset;
      if (option < 40000) {
        if (uVar9 < 0x29) {
          plVar17 = (long *)((ulong)uVar9 + (long)param->reg_save_area);
          param->gp_offset = uVar9 + 8;
        }
        else {
          plVar17 = (long *)param->overflow_arg_area;
          param->overflow_arg_area = plVar17 + 1;
        }
        lVar29 = *plVar17;
        CVar10 = option & 0xffff;
        switch(CVar10) {
        case CURLOPT_INFILESIZE_LARGE:
          if (lVar29 < -1) {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          pcVar36 = &(data->set).filesize;
          break;
        case CURLOPT_RESUME_FROM_LARGE:
          if (lVar29 < -1) {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          pcVar36 = &(data->set).set_resume_from;
          break;
        case CURLOPT_MAXFILESIZE_LARGE:
          if (lVar29 < 0) {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          pcVar36 = &(data->set).max_filesize;
          break;
        case 0x75a6:
        case CURLOPT_RESUME_FROM_LARGE|CURLOPT_PORT:
          goto switchD_0014e305_caseD_f;
        case CURLOPT_POSTFIELDSIZE_LARGE:
          if (lVar29 < -1) {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          pcVar36 = &(data->set).postfieldsize;
          if (((data->set).postfieldsize < lVar29) &&
             (pcVar23 = (data->set).str[0x49], (char *)(data->set).postfields == pcVar23)) {
            (*Curl_cfree)(pcVar23);
            (data->set).str[0x49] = (char *)0x0;
            (data->set).postfields = (void *)0x0;
          }
          break;
        default:
          if (CVar10 == CURLOPT_MAX_SEND_SPEED_LARGE) {
            if (lVar29 < 0) {
              return CURLE_BAD_FUNCTION_ARGUMENT;
            }
            pcVar36 = &(data->set).max_send_speed;
          }
          else if (CVar10 == CURLOPT_MAX_RECV_SPEED_LARGE) {
            if (lVar29 < 0) {
              return CURLE_BAD_FUNCTION_ARGUMENT;
            }
            pcVar36 = &(data->set).max_recv_speed;
          }
          else {
            if (CVar10 != CURLOPT_TIMEVALUE_LARGE) {
              return CURLE_UNKNOWN_OPTION;
            }
            pcVar36 = &(data->set).timevalue;
          }
        }
        *pcVar36 = lVar29;
        goto switchD_0014e305_caseD_5b;
      }
      if (uVar9 < 0x29) {
        puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
        param->gp_offset = uVar9 + 8;
      }
      else {
        puVar16 = (undefined8 *)param->overflow_arg_area;
        param->overflow_arg_area = puVar16 + 1;
      }
      if (0x13 < option - CURLOPT_SSLCERT_BLOB) {
        return CURLE_UNKNOWN_OPTION;
      }
      blob = (curl_blob *)*puVar16;
      switch(option) {
      case CURLOPT_SSLCERT_BLOB:
        lVar29 = 0x928;
        break;
      case CURLOPT_SSLKEY_BLOB:
        lVar29 = 0x930;
        break;
      case CURLOPT_PROXY_SSLCERT_BLOB:
        lVar29 = 0x948;
        break;
      case CURLOPT_PROXY_SSLKEY_BLOB:
        lVar29 = 0x950;
        break;
      case CURLOPT_ISSUERCERT_BLOB:
        lVar29 = 0x938;
        break;
      default:
        goto switchD_0014e305_caseD_f;
      case CURLOPT_PROXY_ISSUERCERT_BLOB:
        lVar29 = 0x958;
        break;
      case CURLOPT_CAINFO_BLOB:
        _Var6 = Curl_ssl_supports(data,0x40);
        lVar29 = 0x940;
        goto LAB_0014ea23;
      case CURLOPT_PROXY_CAINFO_BLOB:
        _Var6 = Curl_ssl_supports(data,0x40);
        lVar29 = 0x960;
LAB_0014ea23:
        if (_Var6 == false) {
          return CURLE_NOT_BUILT_IN;
        }
      }
      CVar13 = Curl_setblobopt((curl_blob **)((long)&data->magic + lVar29),blob);
      return CVar13;
    }
    uVar20 = (ulong)(option - CURLOPT_HTTPHEADER);
    if (option - CURLOPT_HTTPHEADER < 0x30) {
      if ((0x800000010021U >> (uVar20 & 0x3f) & 1) == 0) {
        if (uVar20 == 1) {
          uVar9 = param->gp_offset;
          if ((ulong)uVar9 < 0x29) {
            puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
            param->gp_offset = uVar9 + 8;
          }
          else {
            puVar16 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar16 + 1;
          }
          (data->set).httppost = (curl_httppost *)*puVar16;
          (data->set).method = '\x02';
          puVar1 = &(data->set).field_0x897;
          *puVar1 = *puVar1 & 0xdf;
          Curl_mime_cleanpart((data->state).formp);
          (*Curl_cfree)((data->state).formp);
          (data->state).mimepost = (curl_mimepart *)0x0;
          (data->state).formp = (curl_mimepart *)0x0;
          goto switchD_0014e305_caseD_5b;
        }
        if (uVar20 == 0xe) {
          uVar9 = param->gp_offset;
          if ((ulong)uVar9 < 0x29) {
            plVar17 = (long *)((ulong)uVar9 + (long)param->reg_save_area);
            param->gp_offset = uVar9 + 8;
          }
          else {
            plVar17 = (long *)param->overflow_arg_area;
            param->overflow_arg_area = plVar17 + 1;
          }
          pFVar3 = (FILE *)*plVar17;
          (data->set).err = pFVar3;
          if (pFVar3 == (FILE *)0x0) {
            (data->set).err = _stderr;
            return CURLE_OK;
          }
          return CURLE_OK;
        }
        goto LAB_0014e258;
      }
LAB_0014e4a4:
      uVar9 = param->gp_offset;
      if ((ulong)uVar9 < 0x29) {
        puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
        param->gp_offset = uVar9 + 8;
      }
      else {
        puVar16 = (undefined8 *)param->overflow_arg_area;
        param->overflow_arg_area = puVar16 + 1;
      }
      pcVar24 = (curl_slist *)*puVar16;
      if (option == CURLOPT_HTTPHEADER) {
        lVar29 = 0x300;
      }
      else if (option == CURLOPT_QUOTE) {
        lVar29 = 0x6b8;
      }
      else if (option == CURLOPT_POSTQUOTE) {
        lVar29 = 0x6c0;
      }
      else if (option == CURLOPT_TELNETOPTIONS) {
        lVar29 = 0x4c8;
      }
      else if (option == CURLOPT_PREQUOTE) {
        lVar29 = 0x6c8;
      }
      else if (option == CURLOPT_CONNECT_TO) {
        lVar29 = 0x4d8;
      }
      else if (option == CURLOPT_MAIL_RCPT) {
        lVar29 = 0xa18;
      }
      else if (option == CURLOPT_RESOLVE) {
        (data->set).resolve = pcVar24;
        lVar29 = 0x1240;
      }
      else if (option == CURLOPT_PROXYHEADER) {
        lVar29 = 0x678;
      }
      else {
        if (option != CURLOPT_HTTP200ALIASES) {
          return CURLE_UNKNOWN_OPTION;
        }
        lVar29 = 0x6a0;
      }
      *(curl_slist **)((long)&data->magic + lVar29) = pcVar24;
      goto switchD_0014e305_caseD_5b;
    }
LAB_0014e258:
    uVar9 = option - CURLOPT_MAIL_RCPT;
    if (uVar9 < 0x39) {
      if ((0x100020000010001U >> ((ulong)uVar9 & 0x3f) & 1) != 0) goto LAB_0014e4a4;
      if ((0x60000000000000U >> ((ulong)uVar9 & 0x3f) & 1) != 0) {
        return CURLE_UNKNOWN_OPTION;
      }
    }
    if (option == CURLOPT_PREQUOTE) goto LAB_0014e4a4;
    if (option == CURLOPT_SHARE) {
      uVar9 = param->gp_offset;
      if ((ulong)uVar9 < 0x29) {
        plVar17 = (long *)((ulong)uVar9 + (long)param->reg_save_area);
        param->gp_offset = uVar9 + 8;
      }
      else {
        plVar17 = (long *)param->overflow_arg_area;
        param->overflow_arg_area = plVar17 + 1;
      }
      pCVar18 = (Curl_share *)*plVar17;
      if (data->share != (Curl_share *)0x0) {
        Curl_share_lock(data,CURL_LOCK_DATA_SHARE,CURL_LOCK_ACCESS_SINGLE);
        pCVar2 = data->share;
        if (pCVar2->cookies == data->cookies) {
          data->cookies = (CookieInfo *)0x0;
        }
        if (pCVar2->hsts == data->hsts) {
          data->hsts = (hsts *)0x0;
        }
        if (data->psl == &pCVar2->psl) {
          pPVar33 = &data->multi->psl;
          if (data->multi == (Curl_multi *)0x0) {
            pPVar33 = (PslCache *)0x0;
          }
          data->psl = pPVar33;
        }
        pCVar2->dirty = pCVar2->dirty - 1;
        Curl_share_unlock(data,CURL_LOCK_DATA_SHARE);
        data->share = (Curl_share *)0x0;
      }
      if (pCVar18 != (Curl_share *)0x0) {
        if (pCVar18->magic == 0x7e117a1e) {
          data->share = pCVar18;
          Curl_share_lock(data,CURL_LOCK_DATA_SHARE,CURL_LOCK_ACCESS_SINGLE);
          pCVar18 = data->share;
          pCVar18->dirty = pCVar18->dirty + 1;
          if (pCVar18->cookies != (CookieInfo *)0x0) {
            Curl_cookie_cleanup(data->cookies);
            pCVar18 = data->share;
            data->cookies = pCVar18->cookies;
          }
          if (pCVar18->hsts != (hsts *)0x0) {
            Curl_hsts_cleanup(&data->hsts);
            pCVar18 = data->share;
            data->hsts = pCVar18->hsts;
          }
          if ((pCVar18->specifier & 0x40) != 0) {
            data->psl = &pCVar18->psl;
          }
          Curl_share_unlock(data,CURL_LOCK_DATA_SHARE);
          return CURLE_OK;
        }
        return CURLE_OK;
      }
      return CURLE_OK;
    }
    if (option == CURLOPT_MIMEPOST) {
      uVar9 = param->gp_offset;
      if ((ulong)uVar9 < 0x29) {
        puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
        param->gp_offset = uVar9 + 8;
      }
      else {
        puVar16 = (undefined8 *)param->overflow_arg_area;
        param->overflow_arg_area = puVar16 + 1;
      }
      CVar13 = Curl_mime_set_subparts(&(data->set).mimepost,(curl_mime *)*puVar16,0);
      if (CVar13 == CURLE_OK) {
        (data->set).method = '\x03';
        puVar1 = &(data->set).field_0x897;
        *puVar1 = *puVar1 & 0xdf;
        Curl_mime_cleanpart((data->state).formp);
        (*Curl_cfree)((data->state).formp);
        (data->state).mimepost = (curl_mimepart *)0x0;
        (data->state).formp = (curl_mimepart *)0x0;
        return CURLE_OK;
      }
      return CVar13;
    }
    if (option == CURLOPT_HTTP200ALIASES) goto LAB_0014e4a4;
    uVar9 = param->gp_offset;
    if ((ulong)uVar9 < 0x29) {
      puVar16 = (undefined8 *)((ulong)uVar9 + (long)param->reg_save_area);
      param->gp_offset = uVar9 + 8;
    }
    else {
      puVar16 = (undefined8 *)param->overflow_arg_area;
      param->overflow_arg_area = puVar16 + 1;
    }
    __s = (CURLU *)*puVar16;
    CVar14 = CURLE_OK;
    CVar11 = CURLE_OK;
    CVar35 = CURLE_OK;
    switch(option) {
    case CURLOPT_OPENSOCKETDATA:
      (data->set).opensocket_client = __s;
      CVar11 = CVar35;
      goto switchD_0014eb38_caseD_275c;
    case CURLOPT_COPYPOSTFIELDS:
      if ((__s == (CURLU *)0x0) ||
         (length = (data->set).postfieldsize, length == 0xffffffffffffffff)) {
        CVar14 = Curl_setstropt((data->set).str + 0x49,(char *)__s);
        pcVar23 = (data->set).str[0x49];
      }
      else {
        if ((long)length < 0) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        pcVar23 = (char *)Curl_memdup0((char *)__s,length);
        if (pcVar23 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        (*Curl_cfree)((data->set).str[0x49]);
        (data->set).str[0x49] = pcVar23;
        CVar14 = CURLE_OK;
      }
      (data->set).postfields = pcVar23;
LAB_00150874:
      (data->set).method = '\x01';
      CVar11 = CVar14;
      goto switchD_0014eb38_caseD_275c;
    case 0x27b6:
    case CURLOPT_OPENSOCKETDATA|CURLOPT_PORT:
    case 0x27bb:
    case 0x27bc:
    case 0x27c2:
    case 0x27c4:
    case 0x27c5:
    case 0x27c6:
    case CURLOPT_SSH_KNOWNHOSTS:
    case 0x27c8:
    case CURLOPT_SSH_KEYDATA:
    case CURLOPT_MAIL_RCPT:
    case 0x27cc:
    case CURLOPT_PROXYPASSWORD|CURLOPT_TIMEOUT:
    case 0x27d1:
    case 0x27d2:
    case 0x27d4:
    case 0x27d5:
    case 0x27d6:
    case 0x27d7:
    case 0x27d8:
    case CURLOPT_RESOLVE:
    case 0x27df:
    case CURLOPT_PROXYPASSWORD|CURLOPT_SSLVERSION:
    case CURLOPT_PROXYPASSWORD|CURLOPT_TIMEVALUE:
    case CURLOPT_DNS_SERVERS:
    case 0x27e4:
    case 0x27e5:
    case 0x27e6:
    case 0x27e7:
    case 0x27e8:
    case CURLOPT_PROXYPASSWORD|CURLOPT_HEADER:
    case CURLOPT_PROXYPASSWORD|CURLOPT_NOPROGRESS:
    case CURLOPT_DNS_INTERFACE:
    case CURLOPT_DNS_LOCAL_IP4:
    case CURLOPT_DNS_LOCAL_IP6:
    case 0x27f1:
    case 0x27f2:
    case CURLOPT_LOGIN_OPTIONS|CURLOPT_PORT:
    case CURLOPT_PROXYHEADER:
    case 0x27f5:
    case 0x27f8:
    case 0x27f9:
    case 0x27fa:
    case 0x27fd:
    case 0x27ff:
    case CURLOPT_STREAM_DEPENDS:
    case CURLOPT_STREAM_DEPENDS_E:
    case 0x2802:
    case CURLOPT_CONNECT_TO:
    case 0x2804:
    case 0x2805:
    case 0x2808:
    case 0x2809:
    case 0x280a:
    case 0x2815:
    case 0x2819:
    case 0x281b:
    case 0x281c:
    case CURLOPT_MIMEPOST:
    case 0x281e:
    case 0x281f:
    case CURLOPT_STREAM_DEPENDS|CURLOPT_SSLVERSION:
    case CURLOPT_STREAM_DEPENDS|CURLOPT_TIMEVALUE:
    case 0x2823:
    case 0x2826:
    case 0x2828:
    case CURLOPT_STREAM_DEPENDS|CURLOPT_VERBOSE:
    case 0x282b:
    case 0x282d:
    case 0x282e:
    case CURLOPT_STREAM_DEPENDS|CURLOPT_DIRLISTONLY:
    case CURLOPT_STREAM_DEPENDS|CURLOPT_APPEND:
    case CURLOPT_STREAM_DEPENDS|CURLOPT_NETRC:
    case CURLOPT_STREAM_DEPENDS|CURLOPT_FOLLOWLOCATION:
    case CURLOPT_STREAM_DEPENDS|CURLOPT_TRANSFERTEXT:
    case CURLOPT_STREAM_DEPENDS|CURLOPT_PUT:
    case 0x2837:
    case 0x2839:
    case 0x283b:
    case 0x283d:
    case 0x283f:
    case 0x2842:
    case CURLOPT_HSTSWRITEDATA|CURLOPT_PORT:
    case 0x2844:
    case 0x2845:
    case 0x2846:
    case CURLOPT_SSH_HOST_PUBLIC_KEY_SHA256:
    case 0x2848:
    case 0x284a:
    case 0x284b:
    case 0x284c:
    case CURLOPT_SSH_HOSTKEYDATA:
    case 0x2850:
    case 0x2851:
    case 0x2852:
      goto switchD_0014e305_caseD_f;
    case CURLOPT_SEEKDATA:
      (data->set).seek_client = __s;
      CVar11 = CVar35;
      goto switchD_0014eb38_caseD_275c;
    case CURLOPT_CRLFILE:
      charp = (data->set).str + 10;
      break;
    case CURLOPT_ISSUERCERT:
      charp = (data->set).str + 0xb;
      break;
    case CURLOPT_USERNAME:
      charp = (data->set).str + 0x2d;
      break;
    case CURLOPT_PASSWORD:
      charp = (data->set).str + 0x2e;
      break;
    case CURLOPT_PROXYUSERNAME:
      charp = (data->set).str + 0x30;
      break;
    case CURLOPT_PROXYPASSWORD:
      charp = (data->set).str + 0x31;
      break;
    case CURLOPT_NOPROXY:
      charp = (data->set).str + 0x32;
      break;
    case CURLOPT_SOCKS5_GSSAPI_SERVICE:
    case CURLOPT_PROXY_SERVICE_NAME:
      charp = (data->set).str + 0x19;
      break;
    case CURLOPT_MAIL_FROM:
      charp = (data->set).str + 0x36;
      break;
    case CURLOPT_RTSP_SESSION_ID:
      charp = (data->set).str + 0x33;
      break;
    case CURLOPT_RTSP_STREAM_URI:
      charp = (data->set).str + 0x34;
      break;
    case CURLOPT_RTSP_TRANSPORT:
      charp = (data->set).str + 0x35;
      break;
    case CURLOPT_INTERLEAVEDATA:
      (data->set).rtp_out = __s;
      CVar11 = CVar35;
      goto switchD_0014eb38_caseD_275c;
    case CURLOPT_CHUNK_DATA:
      (data->set).wildcardptr = __s;
      CVar11 = CVar35;
      goto switchD_0014eb38_caseD_275c;
    case CURLOPT_FNMATCH_DATA:
      (data->set).fnmatch_data = __s;
      CVar11 = CVar35;
      goto switchD_0014eb38_caseD_275c;
    case CURLOPT_TLSAUTH_USERNAME:
      charp = (data->set).str + 0x38;
      break;
    case CURLOPT_TLSAUTH_PASSWORD:
      charp = (data->set).str + 0x39;
      break;
    case CURLOPT_TLSAUTH_TYPE:
    case CURLOPT_PROXY_TLSAUTH_TYPE:
      CVar11 = CVar35;
      if ((__s != (CURLU *)0x0) && (iVar12 = curl_strequal((char *)__s,"SRP"), iVar12 == 0)) {
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
      goto switchD_0014eb38_caseD_275c;
    case CURLOPT_CLOSESOCKETDATA:
      (data->set).closesocket_client = __s;
      CVar11 = CVar35;
      goto switchD_0014eb38_caseD_275c;
    case CURLOPT_MAIL_AUTH:
      charp = (data->set).str + 0x37;
      break;
    case CURLOPT_XOAUTH2_BEARER:
      charp = (data->set).str + 0x3c;
      break;
    case CURLOPT_LOGIN_OPTIONS:
      charp = (data->set).str + 0x2f;
      break;
    case CURLOPT_PINNEDPUBLICKEY:
      _Var6 = Curl_ssl_supports(data,4);
      if (!_Var6) {
        return CURLE_NOT_BUILT_IN;
      }
      charp = (data->set).str + 7;
      break;
    case CURLOPT_UNIX_SOCKET_PATH:
      puVar1 = &(data->set).field_0x89a;
      *puVar1 = *puVar1 & 0xfe;
      goto LAB_00150213;
    case CURLOPT_SERVICE_NAME:
      charp = (data->set).str + 0xc;
      break;
    case CURLOPT_DEFAULT_PROTOCOL:
      charp = (data->set).str + 0x1d;
      break;
    case CURLOPT_PROXY_CAINFO:
      charp = (data->set).str + 0x13;
      break;
    case CURLOPT_PROXY_CAPATH:
      _Var6 = Curl_ssl_supports(data,1);
      if (!_Var6) {
        return CURLE_NOT_BUILT_IN;
      }
      charp = (data->set).str + 0x12;
      break;
    case CURLOPT_PROXY_TLSAUTH_USERNAME:
      charp = (data->set).str + 0x3a;
      break;
    case CURLOPT_PROXY_TLSAUTH_PASSWORD:
      charp = (data->set).str + 0x3b;
      break;
    case CURLOPT_PROXY_SSLCERT:
      charp = (data->set).str + 0xd;
      break;
    case CURLOPT_PROXY_SSLCERTTYPE:
      charp = (data->set).str + 0xe;
      break;
    case CURLOPT_PROXY_SSLKEY:
      charp = (data->set).str + 0xf;
      break;
    case CURLOPT_PROXY_SSLKEYTYPE:
      charp = (data->set).str + 0x11;
      break;
    case CURLOPT_PROXY_KEYPASSWD:
      charp = (data->set).str + 0x10;
      break;
    case CURLOPT_PROXY_SSL_CIPHER_LIST:
      _Var6 = Curl_ssl_supports(data,0x200);
      if (!_Var6) {
        return CURLE_NOT_BUILT_IN;
      }
      charp = (data->set).str + 0x15;
      break;
    case CURLOPT_PROXY_CRLFILE:
      charp = (data->set).str + 0x17;
      break;
    case CURLOPT_PRE_PROXY:
      charp = (data->set).str + 0x27;
      break;
    case CURLOPT_PROXY_PINNEDPUBLICKEY:
      _Var6 = Curl_ssl_supports(data,4);
      if (!_Var6) {
        return CURLE_NOT_BUILT_IN;
      }
      charp = (data->set).str + 0x14;
      break;
    case CURLOPT_ABSTRACT_UNIX_SOCKET:
      puVar1 = &(data->set).field_0x89a;
      *puVar1 = *puVar1 | 1;
LAB_00150213:
      charp = (data->set).str + 0x3d;
      break;
    case CURLOPT_REQUEST_TARGET:
      charp = (data->set).str + 0x3e;
      break;
    case CURLOPT_RESOLVER_START_DATA:
      (data->set).resolver_start_client = __s;
      CVar11 = CVar35;
      goto switchD_0014eb38_caseD_275c;
    case CURLOPT_TLS13_CIPHERS:
      _Var6 = Curl_ssl_supports(data,0x20);
      if (!_Var6) {
        return CURLE_NOT_BUILT_IN;
      }
      charp = (data->set).str + 9;
      break;
    case CURLOPT_PROXY_TLS13_CIPHERS:
      _Var6 = Curl_ssl_supports(data,0x20);
      if (!_Var6) {
        return CURLE_NOT_BUILT_IN;
      }
      charp = (data->set).str + 0x16;
      break;
    case CURLOPT_DOH_URL:
      CVar11 = Curl_setstropt((data->set).str + 0x3f,(char *)__s);
      uVar30 = (ulong)((data->set).str[0x3f] != (char *)0x0) << 0x32;
      uVar20 = 0xfffbffffffffffff;
LAB_0015027a:
      *(ulong *)&(data->set).field_0x894 = uVar20 & *(ulong *)&(data->set).field_0x894 | uVar30;
      goto switchD_0014eb38_caseD_275c;
    case CURLOPT_CURLU:
      if (((data->state).field_0x7c0 & 1) == 0) {
        (data->state).url = (char *)0x0;
      }
      else {
        (*Curl_cfree)((data->state).url);
        (data->state).url = (char *)0x0;
        puVar1 = &(data->state).field_0x7c0;
        *puVar1 = *puVar1 & 0xfe;
      }
      (*Curl_cfree)((data->set).str[0x2a]);
      (data->set).str[0x2a] = (char *)0x0;
      (data->set).uh = __s;
      CVar11 = CVar35;
      goto switchD_0014eb38_caseD_275c;
    case CURLOPT_TRAILERDATA:
      (data->set).trailer_data = __s;
      CVar11 = CVar35;
      goto switchD_0014eb38_caseD_275c;
    case CURLOPT_ALTSVC:
      if (data->asi == (altsvcinfo *)0x0) {
        paVar19 = Curl_altsvc_init();
        data->asi = paVar19;
        if (paVar19 == (altsvcinfo *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
      }
      CVar13 = Curl_setstropt((data->set).str + 0x40,(char *)__s);
      if (CVar13 != CURLE_OK) {
        return CVar13;
      }
      CVar11 = CVar35;
      if (__s != (CURLU *)0x0) {
        Curl_altsvc_load(data->asi,(char *)__s);
      }
      goto switchD_0014eb38_caseD_275c;
    case CURLOPT_SASL_AUTHZID:
      charp = (data->set).str + 0x42;
      break;
    case CURLOPT_PROXY_ISSUERCERT:
      charp = (data->set).str + 0x18;
      break;
    case CURLOPT_SSL_EC_CURVES:
      charp = (data->set).str + 0x43;
      break;
    case CURLOPT_HSTS:
      if (data->hsts == (hsts *)0x0) {
        phVar22 = Curl_hsts_init();
        data->hsts = phVar22;
        if (phVar22 == (hsts *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
      }
      if (__s == (CURLU *)0x0) {
        curl_slist_free_all((data->state).hstslist);
        (data->state).hstslist = (curl_slist *)0x0;
        if ((data->share == (Curl_share *)0x0) ||
           (CVar11 = CVar35, data->share->hsts == (hsts *)0x0)) {
          Curl_hsts_cleanup(&data->hsts);
          CVar11 = CVar35;
        }
      }
      else {
        CVar13 = Curl_setstropt((data->set).str + 0x41,(char *)__s);
        if (CVar13 != CURLE_OK) {
          return CVar13;
        }
        pcVar24 = curl_slist_append((data->state).hstslist,(char *)__s);
        if (pcVar24 == (curl_slist *)0x0) {
          curl_slist_free_all((data->state).hstslist);
          (data->state).hstslist = (curl_slist *)0x0;
          return CURLE_OUT_OF_MEMORY;
        }
        (data->state).hstslist = pcVar24;
        CVar11 = CVar35;
      }
      goto switchD_0014eb38_caseD_275c;
    case CURLOPT_HSTSREADDATA:
      (data->set).hsts_read_userp = __s;
      CVar11 = CVar35;
      goto switchD_0014eb38_caseD_275c;
    case CURLOPT_HSTSWRITEDATA:
      (data->set).hsts_write_userp = __s;
      CVar11 = CVar35;
      goto switchD_0014eb38_caseD_275c;
    case CURLOPT_AWS_SIGV4:
      CVar11 = Curl_setstropt((data->set).str + 0x44,(char *)__s);
      if ((data->set).str[0x44] != (char *)0x0) {
        (data->set).httpauth = 0x80;
      }
      goto switchD_0014eb38_caseD_275c;
    case CURLOPT_PREREQDATA:
      (data->set).prereq_userp = __s;
      CVar11 = CVar35;
      goto switchD_0014eb38_caseD_275c;
    case CURLOPT_PROTOCOLS_STR:
      val = &(data->set).allowed_protocols;
      if (__s != (CURLU *)0x0) {
LAB_001502a0:
        CVar13 = protocol2num((char *)__s,val);
        return CVar13;
      }
      *val = 0xffffffff;
      CVar11 = CVar35;
      goto switchD_0014eb38_caseD_275c;
    case CURLOPT_REDIR_PROTOCOLS_STR:
      val = &(data->set).redir_protocols;
      if (__s != (CURLU *)0x0) goto LAB_001502a0;
      *val = 0xf;
      CVar11 = CVar35;
      goto switchD_0014eb38_caseD_275c;
    case CURLOPT_HAPROXY_CLIENT_IP:
      CVar11 = Curl_setstropt((data->set).str + 0x45,(char *)__s);
      puVar1 = &(data->set).field_0x899;
      *puVar1 = *puVar1 | 0x80;
      goto switchD_0014eb38_caseD_275c;
    default:
      switch(option) {
      case CURLOPT_WRITEDATA:
        (data->set).out = __s;
        CVar11 = CVar35;
        break;
      case CURLOPT_URL:
        if (((data->state).field_0x7c0 & 1) != 0) {
          (*Curl_cfree)((data->state).url);
          (data->state).url = (char *)0x0;
          puVar1 = &(data->state).field_0x7c0;
          *puVar1 = *puVar1 & 0xfe;
        }
        CVar11 = Curl_setstropt((data->set).str + 0x2a,(char *)__s);
        (data->state).url = (data->set).str[0x2a];
        break;
      case 0x2713:
      case 0x2718:
      case 0x271b:
      case 0x271c:
      case 0x271d:
      case 0x271e:
      case 0x2723:
      case 0x2724:
      case 0x2725:
      case CURLOPT_HTTPHEADER:
      case CURLOPT_HTTPPOST:
      case 0x272b:
      case CURLOPT_QUOTE:
      case 0x272e:
      case 0x2730:
      case 0x2731:
      case 0x2732:
      case CURLOPT_REFERER|CURLOPT_LOW_SPEED_LIMIT:
        goto switchD_0014e305_caseD_f;
      case CURLOPT_PROXY:
        charp = (data->set).str + 0x26;
        goto LAB_0015083a;
      case CURLOPT_USERPWD:
        CVar13 = setstropt_userpwd((char *)__s,(data->set).str + 0x2d,(data->set).str + 0x2e);
        return CVar13;
      case CURLOPT_PROXYUSERPWD:
        u = (char *)0x0;
        iface = (char *)0x0;
        CVar11 = setstropt_userpwd((char *)__s,&u,&iface);
        pcVar23 = u;
        if (u != (char *)0x0 && CVar11 == CURLE_OK) {
          (*Curl_cfree)((data->set).str[0x30]);
          (data->set).str[0x30] = (char *)0x0;
          CVar11 = Curl_urldecode(pcVar23,0,(data->set).str + 0x30,(size_t *)0x0,REJECT_ZERO);
        }
        string = iface;
        if (iface != (char *)0x0 && CVar11 == CURLE_OK) {
          (*Curl_cfree)((data->set).str[0x31]);
          (data->set).str[0x31] = (char *)0x0;
          CVar11 = Curl_urldecode(string,0,(data->set).str + 0x31,(size_t *)0x0,REJECT_ZERO);
        }
        (*Curl_cfree)(pcVar23);
        (*Curl_cfree)(string);
        break;
      case CURLOPT_RANGE:
        charp = (data->set).str + 0x28;
        goto LAB_0015083a;
      case CURLOPT_READDATA:
        (data->set).in_set = __s;
        CVar11 = CVar35;
        break;
      case CURLOPT_ERRORBUFFER:
        (data->set).errorbuffer = (char *)__s;
        CVar11 = CVar35;
        break;
      case CURLOPT_POSTFIELDS:
        (data->set).postfields = __s;
        (*Curl_cfree)((data->set).str[0x49]);
        (data->set).str[0x49] = (char *)0x0;
        goto LAB_00150874;
      case CURLOPT_REFERER:
        if (((data->state).field_0x7c0 & 2) != 0) {
          (*Curl_cfree)((data->state).referer);
          (data->state).referer = (char *)0x0;
          puVar1 = &(data->state).field_0x7c0;
          *puVar1 = *puVar1 & 0xfd;
        }
        CVar11 = Curl_setstropt((data->set).str + 0x29,(char *)__s);
        (data->state).referer = (data->set).str[0x29];
        break;
      case CURLOPT_FTPPORT:
        CVar11 = Curl_setstropt((data->set).str + 0x24,(char *)__s);
        uVar30 = (ulong)((data->set).str[0x24] != (char *)0x0) << 0xf;
        uVar20 = 0xffffffffffff7fff;
        goto LAB_0015027a;
      case CURLOPT_USERAGENT:
        charp = (data->set).str + 0x2b;
        goto LAB_0015083a;
      case CURLOPT_COOKIE:
        charp = (data->set).str + 0x1a;
        goto LAB_0015083a;
      case CURLOPT_SSLCERT:
        charp = (data->set).str;
        goto LAB_0015083a;
      case CURLOPT_KEYPASSWD:
        charp = (data->set).str + 3;
        goto LAB_0015083a;
      case CURLOPT_HEADERDATA:
        (data->set).writeheader = __s;
        CVar11 = CVar35;
        break;
      case CURLOPT_COOKIEFILE:
        if (__s == (CURLU *)0x0) {
          curl_slist_free_all((data->state).cookielist);
          (data->state).cookielist = (curl_slist *)0x0;
          if ((data->share == (Curl_share *)0x0) || (data->share->cookies == (CookieInfo *)0x0)) {
            Curl_cookie_clearall(data->cookies);
            Curl_cookie_cleanup(data->cookies);
          }
          data->cookies = (CookieInfo *)0x0;
          CVar11 = CVar35;
        }
        else {
          sVar26 = strlen((char *)__s);
          if (8000000 < sVar26) {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          pcVar24 = curl_slist_append((data->state).cookielist,(char *)__s);
          if (pcVar24 == (curl_slist *)0x0) {
            curl_slist_free_all((data->state).cookielist);
            (data->state).cookielist = (curl_slist *)0x0;
            return CURLE_OUT_OF_MEMORY;
          }
          (data->state).cookielist = pcVar24;
          CVar11 = CVar35;
        }
        break;
      case CURLOPT_CUSTOMREQUEST:
        charp = (data->set).str + 0x1c;
        goto LAB_0015083a;
      default:
        switch(option) {
        case CURLOPT_RANDOM_FILE:
        case CURLOPT_EGDSOCKET:
          break;
        case 0x275e:
        case CURLOPT_RANDOM_FILE|CURLOPT_PORT:
        case 0x2760:
        case 0x2761:
        case 0x2764:
        case 0x2765:
        case 0x276a:
        case CURLOPT_SSLKEYTYPE|CURLOPT_PORT:
        case 0x276c:
        case CURLOPT_PREQUOTE:
        case 0x276e:
        case 0x2770:
        case 0x2772:
        case 0x2773:
        case CURLOPT_SHARE:
        case 0x2775:
          goto switchD_0014e305_caseD_f;
        case CURLOPT_COOKIEJAR:
          CVar11 = Curl_setstropt((data->set).str + 0x1b,(char *)__s);
          if (CVar11 == CURLE_OK) {
            pCVar25 = Curl_cookie_init(data,(char *)0x0,data->cookies,
                                       (_Bool)((byte)(data->set).field_0x894 >> 7));
            CVar11 = CURLE_OUT_OF_MEMORY;
            if (pCVar25 != (CookieInfo *)0x0) {
              CVar11 = CURLE_OK;
            }
            data->cookies = pCVar25;
          }
          break;
        case CURLOPT_SSL_CIPHER_LIST:
          _Var6 = Curl_ssl_supports(data,0x200);
          if (!_Var6) {
            return CURLE_NOT_BUILT_IN;
          }
          charp = (data->set).str + 8;
          goto LAB_0015083a;
        case CURLOPT_SSLCERTTYPE:
          charp = (data->set).str + 1;
          goto LAB_0015083a;
        case CURLOPT_SSLKEY:
          charp = (data->set).str + 2;
          goto LAB_0015083a;
        case CURLOPT_SSLKEYTYPE:
          charp = (data->set).str + 4;
          goto LAB_0015083a;
        case CURLOPT_SSLENGINE:
          CVar11 = CVar35;
          if (((__s != (CURLU *)0x0) && (*(char *)&__s->scheme != '\0')) &&
             (CVar11 = Curl_setstropt((data->set).str + 0x2c,(char *)__s), CVar11 == CURLE_OK)) {
            CVar11 = Curl_ssl_set_engine(data,(char *)__s);
          }
          break;
        case CURLOPT_DEBUGDATA:
          (data->set).debugdata = __s;
          CVar11 = CVar35;
          break;
        case CURLOPT_CAPATH:
          _Var6 = Curl_ssl_supports(data,1);
          if (!_Var6) {
            return CURLE_NOT_BUILT_IN;
          }
          charp = (data->set).str + 5;
          goto LAB_0015083a;
        case CURLOPT_ACCEPT_ENCODING:
          if ((__s != (CURLU *)0x0) && (*(char *)&__s->scheme == '\0')) {
            Curl_all_content_encodings((char *)&u,0x100);
            CVar13 = Curl_setstropt((data->set).str + 0x21,(char *)&u);
            return CVar13;
          }
          charp = (data->set).str + 0x21;
          goto LAB_0015083a;
        case CURLOPT_PRIVATE:
          (data->set).private_data = __s;
          CVar11 = CVar35;
          break;
        default:
          if (option == CURLOPT_XFERINFODATA) {
            (data->set).progress_client = __s;
            CVar11 = CVar35;
          }
          else {
            if (option == CURLOPT_INTERFACE) {
              u = (char *)0x0;
              iface = (char *)0x0;
              host = (char *)0x0;
              if ((__s != (CURLU *)0x0) &&
                 (CVar13 = Curl_parse_interface((char *)__s,&u,&iface,&host), CVar13 != CURLE_OK)) {
                return CVar13;
              }
              (*Curl_cfree)((data->set).str[0x1e]);
              (data->set).str[0x1e] = u;
              (*Curl_cfree)((data->set).str[0x1f]);
              (data->set).str[0x1f] = iface;
              (*Curl_cfree)((data->set).str[0x20]);
              (data->set).str[0x20] = host;
              goto switchD_0014e305_caseD_5b;
            }
            if (option == CURLOPT_CAINFO) {
              charp = (data->set).str + 6;
              goto LAB_0015083a;
            }
            if (option == CURLOPT_SSL_CTX_DATA) {
              _Var6 = Curl_ssl_supports(data,8);
              if (!_Var6) {
                return CURLE_NOT_BUILT_IN;
              }
              (data->set).ssl.fsslctxp = __s;
              CVar11 = CVar35;
            }
            else {
              if (option == CURLOPT_NETRC_FILE) {
                charp = (data->set).str + 0x25;
                goto LAB_0015083a;
              }
              if (option == CURLOPT_IOCTLDATA) {
                (data->set).ioctl_client = __s;
                CVar11 = CVar35;
              }
              else {
                if (option == CURLOPT_FTP_ACCOUNT) {
                  charp = (data->set).str + 0x22;
                  goto LAB_0015083a;
                }
                if (option == CURLOPT_COOKIELIST) {
                  if (__s != (CURLU *)0x0) {
                    iVar12 = curl_strequal((char *)__s,"ALL");
                    if (iVar12 == 0) {
                      iVar12 = curl_strequal((char *)__s,"SESS");
                      if (iVar12 == 0) {
                        iVar12 = curl_strequal((char *)__s,"FLUSH");
                        if (iVar12 == 0) {
                          iVar12 = curl_strequal((char *)__s,"RELOAD");
                          if (iVar12 == 0) {
                            if (data->cookies == (CookieInfo *)0x0) {
                              pCVar25 = Curl_cookie_init(data,(char *)0x0,(CookieInfo *)0x0,true);
                              data->cookies = pCVar25;
                              if (pCVar25 == (CookieInfo *)0x0) {
                                return CURLE_OUT_OF_MEMORY;
                              }
                            }
                            sVar26 = strlen((char *)__s);
                            if (8000000 < sVar26) {
                              return CURLE_BAD_FUNCTION_ARGUMENT;
                            }
                            Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
                            iVar12 = curl_strnequal((char *)__s,"Set-Cookie:",0xb);
                            if (iVar12 != 0) {
                              __s = (CURLU *)((long)&__s->user + 3);
                            }
                            Curl_cookie_add(data,data->cookies,iVar12 != 0,false,(char *)__s,
                                            (char *)0x0,(char *)0x0,true);
                            goto LAB_001509aa;
                          }
                          Curl_cookie_loadfiles(data);
                          CVar11 = CVar35;
                        }
                        else {
                          Curl_flush_cookies(data,false);
                          CVar11 = CURLE_OK;
                        }
                        break;
                      }
                      Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
                      Curl_cookie_clearsess(data->cookies);
                    }
                    else {
                      Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
                      Curl_cookie_clearall(data->cookies);
                    }
LAB_001509aa:
                    Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
                    CVar11 = CVar35;
                  }
                }
                else {
                  if (option == CURLOPT_FTP_ALTERNATIVE_TO_USER) {
                    charp = (data->set).str + 0x23;
                    goto LAB_0015083a;
                  }
                  if (option != CURLOPT_SOCKOPTDATA) {
                    return CURLE_UNKNOWN_OPTION;
                  }
                  (data->set).sockopt_client = __s;
                }
              }
            }
          }
        }
      }
switchD_0014eb38_caseD_275c:
      CVar13 = CVar11;
      goto switchD_0014e305_caseD_f;
    }
LAB_0015083a:
    CVar13 = Curl_setstropt(charp,(char *)__s);
    return CVar13;
  }
  uVar9 = param->gp_offset;
  if ((ulong)uVar9 < 0x29) {
    puVar15 = (ulong *)((ulong)uVar9 + (long)param->reg_save_area);
    param->gp_offset = uVar9 + 8;
  }
  else {
    puVar15 = (ulong *)param->overflow_arg_area;
    param->overflow_arg_area = puVar15 + 1;
  }
  uVar30 = *puVar15;
  uVar28 = (ushort)uVar30;
  bVar5 = (byte)uVar30;
  uVar9 = (uint)uVar30;
  switch(option) {
  case CURLOPT_TIMEOUT:
    if (0x20c49b < uVar30) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).timeout = uVar9 * 1000;
    break;
  case CURLOPT_INFILESIZE:
    if ((long)uVar30 < -1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).filesize = uVar30;
    break;
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x16:
  case CURLOPT_LOW_SPEED_TIME|CURLOPT_PORT:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x31:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3e:
  case CURLOPT_POSTFIELDSIZE|CURLOPT_PORT:
  case 0x41:
  case 0x42:
  case CURLOPT_SSL_VERIFYPEER|CURLOPT_PORT:
  case 0x46:
  case 0x48:
  case 0x49:
  case 0x4c:
  case CURLOPT_SSL_VERIFYPEER|CURLOPT_TIMEOUT:
  case 0x4f:
  case 0x52:
  case CURLOPT_HTTPGET|CURLOPT_PORT:
  case 0x56:
  case CURLOPT_HTTP_VERSION|CURLOPT_PORT:
  case 0x58:
  case 0x59:
  case 0x5d:
  case 0x5e:
  case CURLOPT_DNS_CACHE_TIMEOUT|CURLOPT_PORT:
  case 0x61:
  case 100:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x6c:
  case CURLOPT_COOKIESESSION|CURLOPT_TIMEOUT:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x78:
  case 0x7a:
  case 0x7b:
  case 0x7c:
  case CURLOPT_SERVER_RESPONSE_TIMEOUT|CURLOPT_TIMEOUT:
  case CURLOPT_SERVER_RESPONSE_TIMEOUT|CURLOPT_INFILESIZE:
  case 0x7f:
  case 0x80:
  case 0x82:
  case 0x83:
  case 0x84:
  case 0x85:
  case 0x86:
  case 0x87:
  case 0x8e:
  case CURLOPT_LOCALPORTRANGE|CURLOPT_PORT:
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x95:
  case CURLOPT_SSH_AUTH_TYPES:
  case 0x98:
  case 0x99:
  case CURLOPT_NEW_DIRECTORY_PERMS:
  case 0xa2:
  case CURLOPT_NEW_DIRECTORY_PERMS|CURLOPT_PORT:
  case 0xa4:
  case 0xa5:
  case 0xa7:
  case 0xa8:
  case 0xa9:
  case 0xaa:
  case 0xad:
  case 0xae:
  case CURLOPT_CERTINFO|CURLOPT_PORT:
  case 0xb0:
  case 0xb1:
  case 0xb3:
  case CURLOPT_SOCKS5_GSSAPI_NEC:
  case 0xb7:
  case 0xb8:
  case 0xb9:
  case 0xba:
  case CURLOPT_NEW_DIRECTORY_PERMS|CURLOPT_CRLF:
  case 0xbe:
  case CURLOPT_FTP_USE_PRET|CURLOPT_PORT:
  case 0xc0:
  case 0xc3:
  case 0xc4:
  case 0xc6:
  case 199:
  case 200:
  case 0xc9:
  case 0xca:
  case 0xcb:
  case 0xcc:
  case 0xcd:
  case 0xce:
  case 0xd0:
  case 0xd1:
  case CURLOPT_GSSAPI_DELEGATION:
  case 0xd3:
  case 0xd9:
  case 0xdb:
  case 0xdc:
  case 0xdd:
  case 0xde:
  case 0xdf:
  case 0xe0:
  case 0xe4:
  case 0xe6:
  case 0xe7:
  case 0xeb:
  case 0xec:
  case 0xee:
  case 0xf0:
  case 0xf1:
  case 0xf3:
  case 0xf6:
  case CURLOPT_TCP_FASTOPEN|CURLOPT_PORT:
  case 0xfb:
  case 0xfc:
  case 0xfd:
  case 0xfe:
  case 0xff:
  case 0x100:
  case 0x101:
  case 0x102:
  case 0x103:
  case 0x104:
  case 0x106:
  case 0x107:
  case 0x108:
  case 0x10a:
  case CURLOPT_SSH_COMPRESSION:
  case 0x10d:
  case 0x10e:
  case 0x110:
  case 0x111:
  case 0x114:
  case 0x115:
  case 0x117:
  case 0x11a:
  case CURLOPT_UPLOAD_BUFFERSIZE|CURLOPT_PORT:
  case 0x11c:
  case 0x11f:
  case 0x121:
  case 0x123:
  case 0x124:
  case 0x125:
  case 0x126:
  case 0x127:
  case 0x128:
  case 0x129:
  case 0x12a:
  case 300:
  case CURLOPT_MAXAGE_CONN|CURLOPT_TIMEOUT:
  case CURLOPT_MAXAGE_CONN|CURLOPT_INFILESIZE:
  case 0x12f:
  case 0x130:
  case 0x131:
  case 0x135:
  case 0x136:
  case CURLOPT_DOH_SSL_VERIFYSTATUS|CURLOPT_PORT:
  case 0x138:
  case 0x139:
  case 0x13c:
  case 0x13d:
  case 0x13e:
  case 0x13f:
  case 0x143:
  case 0x145:
    goto switchD_0014e305_caseD_f;
  case CURLOPT_LOW_SPEED_LIMIT:
    if ((long)uVar30 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).low_speed_limit = uVar30;
    break;
  case CURLOPT_LOW_SPEED_TIME:
    if ((long)uVar30 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).low_speed_time = uVar30;
    break;
  case CURLOPT_RESUME_FROM:
    if ((long)uVar30 < -1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).set_resume_from = uVar30;
    break;
  case CURLOPT_CRLF:
    uVar20 = (ulong)(uVar30 != 0) << 8;
    uVar30 = 0xfffffffffffffeff;
    goto LAB_0014fab9;
  case CURLOPT_SSLVERSION:
  case CURLOPT_PROXY_SSLVERSION:
    if (0x7ffff < (uVar9 & 0xffff0000)) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    if ((uVar9 & 0xfffe) == 2) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    if ((uVar30 & 0xfff8) != 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    psVar34 = &(data->set).ssl;
    if (option != CURLOPT_SSLVERSION) {
      psVar34 = &(data->set).proxy_ssl;
    }
    (psVar34->primary).version = bVar5;
    (psVar34->primary).version_max = uVar9 & 0xffff0000;
    break;
  case CURLOPT_TIMECONDITION:
    if (3 < uVar30) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).timecondition = bVar5;
    break;
  case CURLOPT_TIMEVALUE:
    (data->set).timevalue = uVar30;
    break;
  case CURLOPT_VERBOSE:
    uVar20 = (ulong)((uint)(uVar30 != 0) << 0x1e);
    uVar30 = 0xffffffffbfffffff;
    goto LAB_0014fab9;
  case CURLOPT_HEADER:
    uVar20 = (ulong)((uint)(uVar30 != 0) << 0x1a);
    uVar30 = 0xfffffffffbffffff;
    goto LAB_0014fab9;
  case CURLOPT_NOPROGRESS:
    *(ulong *)&(data->set).field_0x894 =
         *(ulong *)&(data->set).field_0x894 & 0xffffffffffdfffff | (ulong)(uVar30 != 0) << 0x15;
    uVar9 = (data->progress).flags;
    if (uVar30 == 0) {
      uVar9 = uVar9 & 0xffffffef;
    }
    else {
      uVar9 = uVar9 | 0x10;
    }
    (data->progress).flags = uVar9;
    break;
  case CURLOPT_NOBODY:
    *(ulong *)&(data->set).field_0x894 =
         *(ulong *)&(data->set).field_0x894 & 0xffffffffdfffffff |
         (ulong)((uint)(uVar30 != 0) << 0x1d);
    if (uVar30 == 0) {
      if ((data->set).method == '\x05') goto LAB_0014fdd1;
    }
    else {
      (data->set).method = '\x05';
    }
    break;
  case CURLOPT_FAILONERROR:
    uVar20 = (ulong)(uVar30 != 0) << 0x16;
    uVar30 = 0xffffffffffbfffff;
    goto LAB_0014fab9;
  case CURLOPT_UPLOAD:
  case CURLOPT_PUT:
    if (uVar30 == 0) goto LAB_0014fdd1;
    (data->set).method = '\x04';
LAB_0014f580:
    puVar1 = &(data->set).field_0x897;
    *puVar1 = *puVar1 & 0xdf;
    break;
  case CURLOPT_POST:
    if (uVar30 != 0) {
      (data->set).method = '\x01';
      goto LAB_0014f580;
    }
LAB_0014fdd1:
    (data->set).method = '\0';
    break;
  case CURLOPT_DIRLISTONLY:
    uVar20 = (ulong)(uVar30 != 0) << 0xe;
    uVar30 = 0xffffffffffffbfff;
    goto LAB_0014fab9;
  case CURLOPT_APPEND:
    uVar20 = (ulong)(uVar30 != 0) << 0xd;
    uVar30 = 0xffffffffffffdfff;
    goto LAB_0014fab9;
  case CURLOPT_NETRC:
    if (2 < uVar30) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).use_netrc = bVar5;
    break;
  case CURLOPT_FOLLOWLOCATION:
    if (3 < uVar30) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).http_follow_mode = bVar5;
    break;
  case CURLOPT_TRANSFERTEXT:
    uVar20 = (ulong)(uVar30 != 0) << 0xc;
    uVar30 = 0xffffffffffffefff;
    goto LAB_0014fab9;
  case CURLOPT_AUTOREFERER:
    uVar20 = (ulong)((uint)(uVar30 != 0) << 0x1c);
    uVar30 = 0xffffffffefffffff;
    goto LAB_0014fab9;
  case CURLOPT_PROXYPORT:
    if (0xffff < uVar30) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).proxyport = uVar28;
    break;
  case CURLOPT_POSTFIELDSIZE:
    if ((long)uVar30 < -1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    if (((data->set).postfieldsize < (long)uVar30) &&
       (pcVar23 = (data->set).str[0x49], (char *)(data->set).postfields == pcVar23)) {
      (*Curl_cfree)(pcVar23);
      (data->set).str[0x49] = (char *)0x0;
      (data->set).postfields = (void *)0x0;
    }
    (data->set).postfieldsize = uVar30;
    break;
  case CURLOPT_HTTPPROXYTUNNEL:
    uVar20 = (ulong)(uVar30 != 0) << 0xb;
    uVar30 = 0xfffffffffffff7ff;
    goto LAB_0014fab9;
  case CURLOPT_SSL_VERIFYPEER:
    bVar5 = uVar30 != 0;
    bVar27 = (data->set).ssl.primary.field_0x79 & 0xfe;
    goto LAB_0014f446;
  case CURLOPT_MAXREDIRS:
    if ((long)uVar30 < -1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).maxredirs = uVar30;
    break;
  case CURLOPT_FILETIME:
    uVar20 = (ulong)(uVar30 != 0) << 10;
    uVar30 = 0xfffffffffffffbff;
    goto LAB_0014fab9;
  case CURLOPT_MAXCONNECTS:
    if (uVar30 >> 0x20 != 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).maxconnects = uVar9;
    break;
  case CURLOPT_FRESH_CONNECT:
    uVar20 = (ulong)(uVar30 != 0) << 0x20;
    uVar30 = 0xfffffffeffffffff;
    goto LAB_0014fab9;
  case CURLOPT_FORBID_REUSE:
    uVar20 = (ulong)((uint)(uVar30 != 0) << 0x1f);
    uVar30 = 0xffffffff7fffffff;
    goto LAB_0014fab9;
  case CURLOPT_CONNECTTIMEOUT:
    if (0x20c49b < uVar30) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).connecttimeout = uVar9 * 1000;
    break;
  case CURLOPT_HTTPGET:
    if (uVar30 != 0) {
      (data->set).method = '\0';
      goto LAB_0014f580;
    }
    break;
  case CURLOPT_SSL_VERIFYHOST:
    bVar5 = (uVar30 != 0) * '\x02';
    bVar27 = (data->set).ssl.primary.field_0x79 & 0xfd;
    goto LAB_0014f446;
  case CURLOPT_HTTP_VERSION:
    if (2 < uVar30) {
      if ((long)uVar30 < 0) {
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
    (data->set).httpwant = bVar5;
    break;
  case CURLOPT_FTP_USE_EPSV:
    uVar20 = (ulong)(uVar30 != 0) << 0x10;
    uVar30 = 0xfffffffffffeffff;
    goto LAB_0014fab9;
  case CURLOPT_SSLENGINE_DEFAULT:
    (*Curl_cfree)((data->set).str[0x2c]);
    (data->set).str[0x2c] = (char *)0x0;
    CVar13 = Curl_ssl_set_engine_default(data);
    return CVar13;
  case CURLOPT_DNS_USE_GLOBAL_CACHE:
  case CURLOPT_SSL_ENABLE_NPN:
    break;
  case CURLOPT_DNS_CACHE_TIMEOUT:
    if ((long)uVar30 < -1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar20 = 0x7fffffff;
    if ((long)uVar30 < 0x7fffffff) {
      uVar20 = uVar30;
    }
    (data->set).dns_cache_timeout = (int)uVar20;
    break;
  case CURLOPT_COOKIESESSION:
    uVar20 = (ulong)(uVar30 != 0) << 7;
    uVar30 = 0xffffffffffffff7f;
    goto LAB_0014fab9;
  case CURLOPT_BUFFERSIZE:
    uVar9 = 0xa00000;
    if ((long)uVar30 < 0xa00001) {
      if ((long)uVar30 < 1) {
        uVar9 = 0x4000;
      }
      else {
        uVar20 = 0x400;
        if (0x400 < uVar30) {
          uVar20 = uVar30;
        }
        uVar9 = (uint)uVar20;
      }
    }
    (data->set).buffer_size = uVar9;
    break;
  case CURLOPT_NOSIGNAL:
    uVar20 = (ulong)(uVar30 != 0) << 0x21;
    uVar30 = 0xfffffffdffffffff;
    goto LAB_0014fab9;
  case CURLOPT_PROXYTYPE:
    if (7 < uVar30) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).proxytype = bVar5;
    break;
  case CURLOPT_UNRESTRICTED_AUTH:
    uVar20 = (ulong)((uint)(uVar30 != 0) << 0x19);
    uVar30 = 0xfffffffffdffffff;
    goto LAB_0014fab9;
  case CURLOPT_FTP_USE_EPRT:
    uVar20 = (ulong)(uVar30 != 0) << 0x11;
    uVar30 = 0xfffffffffffdffff;
    goto LAB_0014fab9;
  case CURLOPT_HTTPAUTH:
    _Var6 = false;
    goto LAB_0014f717;
  case CURLOPT_FTP_CREATE_MISSING_DIRS:
    if (2 < uVar30) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).ftp_create_missing_dirs = bVar5;
    break;
  case CURLOPT_PROXYAUTH:
    _Var6 = true;
LAB_0014f717:
    CVar13 = httpauth(data,_Var6,uVar30);
    return CVar13;
  case CURLOPT_SERVER_RESPONSE_TIMEOUT:
    if (0x20c49b < uVar30) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).server_response_timeout = uVar9 * 1000;
    break;
  case CURLOPT_IPRESOLVE:
    if (2 < uVar30) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).ipver = bVar5;
    break;
  case CURLOPT_MAXFILESIZE:
    if ((long)uVar30 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).max_filesize = uVar30;
    break;
  case CURLOPT_USE_SSL:
    if (3 < uVar30) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).use_ssl = bVar5;
    break;
  case CURLOPT_TCP_NODELAY:
    uVar20 = (ulong)(uVar30 != 0) << 0x22;
    uVar30 = 0xfffffffbffffffff;
    goto LAB_0014fab9;
  case CURLOPT_FTPSSLAUTH:
    if (2 < uVar30) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).ftpsslauth = bVar5;
    break;
  case CURLOPT_IGNORE_CONTENT_LENGTH:
    uVar20 = (ulong)(uVar30 != 0) << 0x23;
    uVar30 = 0xfffffff7ffffffff;
    goto LAB_0014fab9;
  case CURLOPT_FTP_SKIP_PASV_IP:
    uVar20 = (ulong)(uVar30 != 0) << 0x13;
    uVar30 = 0xfffffffffff7ffff;
    goto LAB_0014fab9;
  case CURLOPT_FTP_FILEMETHOD:
    if (3 < uVar30) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).ftp_filemethod = bVar5;
    break;
  case CURLOPT_LOCALPORT:
    if (0xffff < uVar30) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar8 = curlx_sltous(uVar30);
    (data->set).localport = uVar8;
    break;
  case CURLOPT_LOCALPORTRANGE:
    if (0xffff < uVar30) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar8 = curlx_sltous(uVar30);
    (data->set).localportrange = uVar8;
    break;
  case CURLOPT_CONNECT_ONLY:
    if (2 < (long)uVar30) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar20 = (ulong)(uVar30 != 0) + (ulong)(uVar30 == 2) * 2 |
             *(ulong *)&(data->set).field_0x894 & 0xfffffffffffffffc;
    goto LAB_0014fb88;
  case CURLOPT_SSL_SESSIONID_CACHE:
    bVar27 = (uVar30 != 0) << 3;
    bVar5 = (data->set).proxy_ssl.primary.field_0x79;
    (data->set).ssl.primary.field_0x79 = (data->set).ssl.primary.field_0x79 & 0xf7 | bVar27;
    (data->set).proxy_ssl.primary.field_0x79 = bVar5 & 0xf7 | bVar27;
    break;
  case CURLOPT_FTP_SSL_CCC:
    if (2 < uVar30) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).ftp_ccc = bVar5;
    break;
  case CURLOPT_TIMEOUT_MS:
    uVar20 = 0xffffffff;
    if (uVar30 < 0xffffffff) {
      uVar20 = uVar30;
    }
    (data->set).timeout = (uint)uVar20;
    break;
  case CURLOPT_CONNECTTIMEOUT_MS:
    uVar20 = 0xffffffff;
    if (uVar30 < 0xffffffff) {
      uVar20 = uVar30;
    }
    (data->set).connecttimeout = (uint)uVar20;
    break;
  case CURLOPT_HTTP_TRANSFER_DECODING:
    uVar20 = (ulong)(uVar30 == 0) << 0x24;
    uVar30 = 0xffffffefffffffff;
    goto LAB_0014fab9;
  case CURLOPT_HTTP_CONTENT_DECODING:
    uVar20 = (ulong)(uVar30 == 0) << 0x25;
    uVar30 = 0xffffffdfffffffff;
    goto LAB_0014fab9;
  case CURLOPT_NEW_FILE_PERMS:
    if (0x1ff < uVar30) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).new_file_perms = uVar9;
    break;
  case CURLOPT_POSTREDIR:
    if ((long)uVar30 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).keep_post = bVar5 & 7;
    break;
  case CURLOPT_PROXY_TRANSFER_MODE:
    if (1 < uVar30) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar30 = uVar30 << 0x26;
    uVar20 = 0xffffffbfffffffff;
    goto LAB_0014fa94;
  case CURLOPT_ADDRESS_SCOPE:
    if (uVar30 >> 0x20 != 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).scope_id = uVar9;
    break;
  case CURLOPT_CERTINFO:
    _Var6 = Curl_ssl_supports(data,2);
    if (!_Var6) {
      return CURLE_NOT_BUILT_IN;
    }
    uVar7 = (ushort)(uVar30 != 0);
    uVar28 = (ushort)*(undefined4 *)&(data->set).ssl.field_0xc0 & 0xfffe;
    goto LAB_0014ef62;
  case CURLOPT_TFTP_BLKSIZE:
    uVar20 = 0xffb8;
    if (uVar30 < 0xffb8) {
      uVar20 = uVar30;
    }
    uVar31 = 0x200;
    if (7 < (long)uVar30) {
      uVar31 = uVar20;
    }
    (data->set).tftp_blksize = uVar31;
    break;
  case CURLOPT_PROTOCOLS:
    (data->set).allowed_protocols = uVar9;
    break;
  case CURLOPT_REDIR_PROTOCOLS:
    (data->set).redir_protocols = uVar9;
    break;
  case CURLOPT_FTP_USE_PRET:
    uVar20 = (ulong)(uVar30 != 0) << 0x12;
    uVar30 = 0xfffffffffffbffff;
    goto LAB_0014fab9;
  case CURLOPT_RTSP_REQUEST:
    if (10 < uVar30 - 1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).rtspreq = (int)(uVar30 - 1) + RTSPREQ_OPTIONS;
    break;
  case CURLOPT_RTSP_CLIENT_CSEQ:
    (data->state).rtsp_next_client_CSeq = uVar30;
    break;
  case CURLOPT_RTSP_SERVER_CSEQ:
    (data->state).rtsp_next_server_CSeq = uVar30;
    break;
  case CURLOPT_WILDCARDMATCH:
    uVar20 = (ulong)(uVar30 != 0) << 0x14;
    uVar30 = 0xffffffffffefffff;
    goto LAB_0014fab9;
  case CURLOPT_TRANSFER_ENCODING:
    uVar20 = (ulong)(uVar30 != 0) << 0x18;
    uVar30 = 0xfffffffffeffffff;
    goto LAB_0014fab9;
  case CURLOPT_ACCEPTTIMEOUT_MS:
    uVar20 = 0xffffffff;
    if (uVar30 < 0xffffffff) {
      uVar20 = uVar30;
    }
    (data->set).accepttimeout = (uint)uVar20;
    break;
  case CURLOPT_TCP_KEEPALIVE:
    uVar20 = (ulong)(uVar30 != 0) << 0x28;
    uVar30 = 0xfffffeffffffffff;
    goto LAB_0014fab9;
  case CURLOPT_TCP_KEEPIDLE:
    if ((long)uVar30 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar20 = 0x7fffffff;
    if (uVar30 < 0x7fffffff) {
      uVar20 = uVar30;
    }
    (data->set).tcp_keepidle = (int)uVar20;
    break;
  case CURLOPT_TCP_KEEPINTVL:
    if ((long)uVar30 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar20 = 0x7fffffff;
    if (uVar30 < 0x7fffffff) {
      uVar20 = uVar30;
    }
    (data->set).tcp_keepintvl = (int)uVar20;
    break;
  case CURLOPT_SSL_OPTIONS:
    (data->set).ssl.primary.ssl_options = bVar5;
    uVar7 = (ushort)*(undefined4 *)&(data->set).ssl.field_0xc0 & 0xfe03;
    uVar28 = ((ushort)(uVar30 >> 4) & 4) + (uVar28 & 0x3f) * 8;
LAB_0014ef62:
    *(ushort *)&(data->set).ssl.field_0xc0 = uVar28 | uVar7;
    break;
  case CURLOPT_SASL_IR:
    uVar20 = (ulong)(uVar30 != 0) << 0x27;
    uVar30 = 0xffffff7fffffffff;
    goto LAB_0014fab9;
  case CURLOPT_SSL_ENABLE_ALPN:
    uVar20 = (ulong)(uVar30 != 0) << 0x2a;
    uVar30 = 0xfffffbffffffffff;
    goto LAB_0014fab9;
  case CURLOPT_EXPECT_100_TIMEOUT_MS:
    if ((long)uVar30 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).expect_100_timeout = uVar30;
    break;
  case CURLOPT_HEADEROPT:
    uVar30 = (ulong)((uVar9 & 1) << 6);
    uVar20 = *(ulong *)&(data->set).field_0x894 & 0xffffffffffffffbf;
    goto LAB_0014fa9b;
  case CURLOPT_SSL_VERIFYSTATUS:
    _Var6 = Curl_ssl_cert_status_request();
    if (!_Var6) {
      return CURLE_NOT_BUILT_IN;
    }
    bVar5 = (uVar30 != 0) << 2;
    bVar27 = (data->set).ssl.primary.field_0x79 & 0xfb;
LAB_0014f446:
    (data->set).ssl.primary.field_0x79 = bVar27 | bVar5;
    _Var6 = false;
LAB_0014f8d4:
    Curl_ssl_conn_config_update(data,_Var6);
    break;
  case CURLOPT_SSL_FALSESTART:
    _Var6 = Curl_ssl_false_start();
    if (!_Var6) {
      return CURLE_NOT_BUILT_IN;
    }
    *(ushort *)&(data->set).ssl.field_0xc0 =
         ((ushort)*(undefined4 *)&(data->set).ssl.field_0xc0 & 0xfffd) + (ushort)(uVar30 != 0) * 2;
    break;
  case CURLOPT_PATH_AS_IS:
    uVar20 = (ulong)(uVar30 != 0) << 0x2b;
    uVar30 = 0xfffff7ffffffffff;
    goto LAB_0014fab9;
  case CURLOPT_PIPEWAIT:
    uVar20 = (ulong)(uVar30 != 0) << 0x2c;
    uVar30 = 0xffffefffffffffff;
    goto LAB_0014fab9;
  case CURLOPT_STREAM_WEIGHT:
    return CURLE_NOT_BUILT_IN;
  case CURLOPT_TFTP_NO_OPTIONS:
    uVar20 = (ulong)(uVar30 != 0) << 5;
    uVar30 = *(ulong *)&(data->set).field_0x894 & 0xffffffffffffffdf;
    goto LAB_0014fac0;
  case CURLOPT_TCP_FASTOPEN:
    uVar20 = (ulong)(uVar30 != 0) << 0x29;
    uVar30 = 0xfffffdffffffffff;
    goto LAB_0014fab9;
  case CURLOPT_KEEP_SENDING_ON_ERROR:
    uVar20 = (ulong)(uVar30 != 0) << 0x17;
    uVar30 = 0xffffffffff7fffff;
    goto LAB_0014fab9;
  case CURLOPT_PROXY_SSL_VERIFYPEER:
    bVar5 = uVar30 != 0;
    bVar27 = (data->set).proxy_ssl.primary.field_0x79 & 0xfe;
    goto LAB_0014f8c6;
  case CURLOPT_PROXY_SSL_VERIFYHOST:
    bVar5 = (uVar30 != 0) * '\x02';
    bVar27 = (data->set).proxy_ssl.primary.field_0x79 & 0xfd;
LAB_0014f8c6:
    (data->set).proxy_ssl.primary.field_0x79 = bVar27 | bVar5;
    _Var6 = true;
    goto LAB_0014f8d4;
  case CURLOPT_PROXY_SSL_OPTIONS:
    (data->set).proxy_ssl.primary.ssl_options = bVar5;
    *(ushort *)&(data->set).proxy_ssl.field_0xc0 =
         ((ushort)*(undefined4 *)&(data->set).proxy_ssl.field_0xc0 & 0xfe07) + (uVar28 & 0x3f) * 8;
    break;
  case CURLOPT_SUPPRESS_CONNECT_HEADERS:
    uVar20 = (ulong)(uVar30 != 0) << 0x2d;
    uVar30 = 0xffffdfffffffffff;
    goto LAB_0014fab9;
  case CURLOPT_SOCKS5_AUTH:
    if ((uVar30 & 0xfffffffffffffffa) != 0) {
      return CURLE_NOT_BUILT_IN;
    }
    (data->set).socks5auth = bVar5;
    break;
  case CURLOPT_HAPPY_EYEBALLS_TIMEOUT_MS:
    uVar20 = 0xffffffff;
    if (uVar30 < 0xffffffff) {
      uVar20 = uVar30;
    }
    (data->set).happy_eyeballs_timeout = (uint)uVar20;
    break;
  case CURLOPT_HAPROXYPROTOCOL:
    uVar20 = (ulong)(uVar30 != 0) << 0x2f;
    uVar30 = 0xffff7fffffffffff;
    goto LAB_0014fab9;
  case CURLOPT_DNS_SHUFFLE_ADDRESSES:
    uVar20 = (ulong)(uVar30 != 0) << 0x2e;
    uVar30 = 0xffffbfffffffffff;
    goto LAB_0014fab9;
  case CURLOPT_DISALLOW_USERNAME_IN_URL:
    uVar20 = (ulong)(uVar30 != 0) << 0x31;
    uVar30 = 0xfffdffffffffffff;
    goto LAB_0014fab9;
  case CURLOPT_UPLOAD_BUFFERSIZE:
    uVar20 = 0x4000;
    if (0x4000 < (long)uVar30) {
      uVar20 = uVar30;
    }
    if (0x1fffff < (long)uVar20) {
      uVar20 = 0x200000;
    }
    (data->set).upload_buffer_size = (uint)uVar20;
    break;
  case CURLOPT_UPKEEP_INTERVAL_MS:
    if ((long)uVar30 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).upkeep_interval_ms = uVar30;
    break;
  case CURLOPT_HTTP09_ALLOWED:
    uVar20 = (ulong)(uVar30 != 0) << 0x36;
    uVar30 = 0xffbfffffffffffff;
    goto LAB_0014fab9;
  case CURLOPT_ALTSVC_CTRL:
    if (uVar30 == 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    paVar19 = data->asi;
    if (paVar19 == (altsvcinfo *)0x0) {
      paVar19 = Curl_altsvc_init();
      data->asi = paVar19;
      if (paVar19 == (altsvcinfo *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    CVar13 = Curl_altsvc_ctrl(paVar19,uVar30);
    return CVar13;
  case CURLOPT_MAXAGE_CONN:
    if ((long)uVar30 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).maxage_conn = uVar30;
    break;
  case CURLOPT_MAIL_RCPT_ALLOWFAILS:
    uVar20 = (*(ulong *)&(data->set).field_0x894 & 0xfffffffffffffffb) + (ulong)(uVar30 != 0) * 4;
    goto LAB_0014fb88;
  case CURLOPT_HSTS_CTRL:
    hp = &data->hsts;
    if ((uVar30 & 1) == 0) {
      Curl_hsts_cleanup(hp);
    }
    else if (*hp == (hsts *)0x0) {
      phVar22 = Curl_hsts_init();
      *hp = phVar22;
      if (phVar22 == (hsts *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    break;
  case CURLOPT_DOH_SSL_VERIFYPEER:
    uVar20 = (ulong)(uVar30 != 0) << 0x33;
    uVar30 = 0xfff7ffffffffffff;
    goto LAB_0014fab9;
  case CURLOPT_DOH_SSL_VERIFYHOST:
    uVar20 = (ulong)(uVar30 != 0) << 0x34;
    uVar30 = 0xffefffffffffffff;
    goto LAB_0014fab9;
  case CURLOPT_DOH_SSL_VERIFYSTATUS:
    _Var6 = Curl_ssl_cert_status_request();
    if (!_Var6) {
      return CURLE_NOT_BUILT_IN;
    }
    uVar20 = (ulong)(uVar30 != 0) << 0x35;
    uVar30 = 0xffdfffffffffffff;
    goto LAB_0014fab9;
  case CURLOPT_MAXLIFETIME_CONN:
    if ((long)uVar30 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).maxlifetime_conn = uVar30;
    break;
  case CURLOPT_MIME_OPTIONS:
    uVar20 = (*(ulong *)&(data->set).field_0x894 & 0xfffffffffffffff7) + (ulong)(uVar9 & 1) * 8;
    goto LAB_0014fb88;
  case CURLOPT_WS_OPTIONS:
    uVar30 = (ulong)(uVar9 & 1) << 0x37;
    uVar20 = 0xff7fffffffffffff;
LAB_0014fa94:
    uVar20 = uVar20 & *(ulong *)&(data->set).field_0x894;
LAB_0014fa9b:
    uVar20 = uVar20 | uVar30;
LAB_0014fb88:
    *(ulong *)&(data->set).field_0x894 = uVar20;
    break;
  case CURLOPT_CA_CACHE_TIMEOUT:
    _Var6 = Curl_ssl_supports(data,0x100);
    if (!_Var6) {
      return CURLE_NOT_BUILT_IN;
    }
    if ((long)uVar30 < -1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar20 = 0x7fffffff;
    if ((long)uVar30 < 0x7fffffff) {
      uVar20 = uVar30;
    }
    (data->set).general_ssl.ca_cache_timeout = (int)uVar20;
    break;
  case CURLOPT_QUICK_EXIT:
    uVar20 = (ulong)(uVar30 != 0) << 9;
    uVar30 = 0xfffffffffffffdff;
LAB_0014fab9:
    uVar30 = uVar30 & *(ulong *)&(data->set).field_0x894;
LAB_0014fac0:
    *(ulong *)&(data->set).field_0x894 = uVar30 | uVar20;
    break;
  case CURLOPT_SERVER_RESPONSE_TIMEOUT_MS:
    if (0x7fffffff < uVar30) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).server_response_timeout = uVar9;
    break;
  case CURLOPT_TCP_KEEPCNT:
    if ((long)uVar30 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar20 = 0x7fffffff;
    if (uVar30 < 0x7fffffff) {
      uVar20 = uVar30;
    }
    (data->set).tcp_keepcnt = (int)uVar20;
    break;
  case CURLOPT_UPLOAD_FLAGS:
    (data->set).upload_flags = bVar5;
    break;
  default:
    if (option != CURLOPT_PORT) {
      return CURLE_UNKNOWN_OPTION;
    }
    if (0xffff < uVar30) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).use_port = uVar28;
  }
switchD_0014e305_caseD_5b:
  CVar13 = CURLE_OK;
switchD_0014e305_caseD_f:
  return CVar13;
}

Assistant:

CURLcode Curl_vsetopt(struct Curl_easy *data, CURLoption option, va_list param)
{
  if(option < CURLOPTTYPE_OBJECTPOINT)
    return setopt_long(data, option, va_arg(param, long));
  else if(option < CURLOPTTYPE_FUNCTIONPOINT) {
    /* unfortunately, different pointer types cannot be identified any other
       way than being listed explicitly */
    switch(option) {
    case CURLOPT_HTTPHEADER:
    case CURLOPT_QUOTE:
    case CURLOPT_POSTQUOTE:
    case CURLOPT_TELNETOPTIONS:
    case CURLOPT_PREQUOTE:
    case CURLOPT_HTTP200ALIASES:
    case CURLOPT_MAIL_RCPT:
    case CURLOPT_RESOLVE:
    case CURLOPT_PROXYHEADER:
    case CURLOPT_CONNECT_TO:
      return setopt_slist(data, option, va_arg(param, struct curl_slist *));
    case CURLOPT_HTTPPOST:         /* curl_httppost * */
    case CURLOPT_MIMEPOST:         /* curl_mime * */
    case CURLOPT_STDERR:           /* FILE * */
    case CURLOPT_SHARE:            /* CURLSH * */
    case CURLOPT_STREAM_DEPENDS:   /* CURL * */
    case CURLOPT_STREAM_DEPENDS_E: /* CURL * */
      return setopt_pointers(data, option, param);
    default:
      break;
    }
    /* the char pointer options */
    return setopt_cptr(data, option, va_arg(param, char *));
  }
  else if(option < CURLOPTTYPE_OFF_T)
    return setopt_func(data, option, param);
  else if(option < CURLOPTTYPE_BLOB)
    return setopt_offt(data, option, va_arg(param, curl_off_t));
  return setopt_blob(data, option, va_arg(param, struct curl_blob *));
}